

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

void __thiscall Json::FastWriter::~FastWriter(FastWriter *this)

{
  pointer pcVar1;
  
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__FastWriter_00137be8;
  pcVar1 = (this->document_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->document_).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

virtual ~FastWriter() {}